

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa-gpio.c
# Opt level: O0

mraa_result_t gpio_get(int pin,int *level,mraa_boolean_t raw)

{
  int iVar1;
  long lVar2;
  mraa_gpio_context gpio;
  mraa_boolean_t raw_local;
  int *level_local;
  int pin_local;
  
  lVar2 = mraa_gpio_init(pin);
  if (lVar2 == 0) {
    level_local._4_4_ = MRAA_ERROR_INVALID_RESOURCE;
  }
  else {
    mraa_gpio_dir(lVar2,1);
    if ((raw != 0) && (iVar1 = mraa_gpio_use_mmaped(lVar2,1), iVar1 != 0)) {
      fprintf(_stdout,"mmapped access to gpio %d not supported, falling back to normal mode\n",
              (ulong)(uint)pin);
    }
    iVar1 = mraa_gpio_read(lVar2);
    *level = iVar1;
    level_local._4_4_ = MRAA_SUCCESS;
  }
  return level_local._4_4_;
}

Assistant:

mraa_result_t
gpio_get(int pin, int* level, mraa_boolean_t raw)
{
    mraa_gpio_context gpio = mraa_gpio_init(pin);
    if (gpio != NULL) {
        mraa_gpio_dir(gpio, MRAA_GPIO_IN);
        if (raw != 0) {
            if (mraa_gpio_use_mmaped(gpio, 1) != MRAA_SUCCESS) {
                fprintf(stdout,
                        "mmapped access to gpio %d not supported, falling back to normal mode\n", pin);
            }
        }
        *level = mraa_gpio_read(gpio);
        return MRAA_SUCCESS;
    }
    return MRAA_ERROR_INVALID_RESOURCE;
}